

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O3

void __thiscall SQLiteTestFixture::teardown(SQLiteTestFixture *this)

{
  string local_70;
  undefined1 local_50 [16];
  undefined1 *local_40;
  char *local_38;
  const_string local_20;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"drop table TEST_TABLE;","");
  cpp_db::statement::statement
            ((statement *)local_50,&local_70,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_50);
  cpp_db::statement::~statement((statement *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x23;
  local_70._M_dataplus._M_p._0_1_ = 1;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity = 0;
  local_50[8] = false;
  local_50._0_8_ = &PTR__lazy_ostream_00196408;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_38 = 
  "no exceptions thrown by cpp_db::statement(\"drop table TEST_TABLE;\", *con).execute_non_query()";
  local_20.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_20.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_70,(lazy_ostream *)local_50,&local_20,0x23,CHECK,CHECK_MSG,0
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_70.field_2._M_allocated_capacity);
  return;
}

Assistant:

void teardown()
    {
        BOOST_CHECK_NO_THROW(cpp_db::statement("drop table TEST_TABLE;", *con).execute_non_query());
    }